

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void __thiscall flatbuffers::Parser::SerializeStruct(Parser *this,StructDef *struct_def,Value *val)

{
  FlatBufferBuilder *this_00;
  pointer puVar1;
  size_t len;
  ulonglong val_00;
  uint8_t *puVar2;
  size_t sVar3;
  
  val_00 = strtoull((val->constant)._M_dataplus._M_p,(char **)0x0,10);
  CheckBitsFit(val_00,0x20);
  if ((long)(this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)((this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start + (val_00 & 0xffffffff)) ==
      struct_def->bytesize) {
    this_00 = &this->builder_;
    FlatBufferBuilder::Align(this_00,struct_def->minalign);
    puVar1 = (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    len = struct_def->bytesize;
    puVar2 = vector_downward::make_space(&this_00->buf_,len);
    if (len != 0) {
      sVar3 = 0;
      do {
        puVar2[sVar3] = puVar1[sVar3 + (val_00 & 0xffffffff)];
        sVar3 = sVar3 + 1;
      } while (len != sVar3);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->struct_stack_,
               (long)(this->struct_stack_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((this->struct_stack_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + struct_def->bytesize));
    FlatBufferBuilder::TrackField
              (this_00,(voffset_t)val->offset,
               ((int)(this->builder_).buf_.reserved_ - *(int *)&(this->builder_).buf_.cur_) +
               *(int *)&(this->builder_).buf_.buf_);
    return;
  }
  __assert_fail("struct_stack_.size() - off == struct_def.bytesize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/src/idl_parser.cpp"
                ,0x16f,"void flatbuffers::Parser::SerializeStruct(const StructDef &, const Value &)"
               );
}

Assistant:

void Parser::SerializeStruct(const StructDef &struct_def, const Value &val) {
  auto off = atot<uoffset_t>(val.constant.c_str());
  assert(struct_stack_.size() - off == struct_def.bytesize);
  builder_.Align(struct_def.minalign);
  builder_.PushBytes(&struct_stack_[off], struct_def.bytesize);
  struct_stack_.resize(struct_stack_.size() - struct_def.bytesize);
  builder_.AddStructOffset(val.offset, builder_.GetSize());
}